

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::InitializePostGlobal(ScriptContext *this)

{
  ScriptContextProfiler *pSVar1;
  code *pcVar2;
  bool bVar3;
  DebugContext *pDVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *ptr;
  HeapAllocator *pHVar7;
  InterpreterThunkEmitter *pIVar8;
  undefined1 local_60 [8];
  TrackAllocData data;
  AutoCriticalSection critSec;
  
  pDVar4 = GetDebugContext(this);
  DebugContext::Initialize(pDVar4);
  pDVar4 = GetDebugContext(this);
  ProbeContainer::Initialize(pDVar4->diagProbesContainer,this);
  this->isDebugContextInitialized = true;
  if (this->CurrentThunk != InterpreterStackFrame::DelayDynamicInterpreterThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x53f,
                                "(this->CurrentThunk == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk)"
                                ,"Creating non default thunk while initializing");
    if (!bVar3) goto LAB_006eb698;
    *puVar5 = 0;
  }
  if (this->DeferredParsingThunk != JavascriptFunction::DeferredParsingThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x540,
                                "(this->DeferredParsingThunk == Js::JavascriptFunction::DeferredParsingThunk)"
                                ,"Creating non default thunk while initializing");
    if (!bVar3) goto LAB_006eb698;
    *puVar5 = 0;
  }
  if (this->DeferredDeserializationThunk != JavascriptFunction::DeferredDeserializeThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x541,
                                "(this->DeferredDeserializationThunk == Js::JavascriptFunction::DeferredDeserializeThunk)"
                                ,"Creating non default thunk while initializing");
    if (!bVar3) {
LAB_006eb698:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_60 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x544;
  pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
  this_00 = (BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar6,0x37a1d4);
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,this->recycler,0);
  this->fieldAccessStatsByFunctionNumber = this_00;
  BindReference(this,this_00);
  if ((this->sourceList).ptr ==
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    data._32_8_ = &this->threadContext->csFunctionBody;
    CCLock::Enter((CCLock *)data._32_8_);
    local_60 = (undefined1  [8])
               &JsUtil::
                List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::FreeListedRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename._0_4_ = 0x54b;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    ptr = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
           *)new<Memory::Recycler>(0x30,pRVar6,0x37a1d4);
    pRVar6 = this->recycler;
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).alloc = pRVar6;
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01378bf8;
    (ptr->removePolicy).freeItemIndex = -1;
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_> *)0x0;
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    ptr->length = 0;
    ptr->increment = 4;
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
    ::Root(&this->sourceList,ptr,pRVar6);
    AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&data.line);
  }
  local_60 = (undefined1  [8])&InterpreterThunkEmitter::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x54f;
  pHVar7 = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
  pIVar8 = (InterpreterThunkEmitter *)new<Memory::HeapAllocator>(0x290,pHVar7,0x2f6726);
  InterpreterThunkEmitter::InterpreterThunkEmitter
            (pIVar8,this,&this->sourceCodeAllocator,&this->threadContext->thunkPageAllocators,false)
  ;
  this->interpreterThunkEmitter = pIVar8;
  local_60 = (undefined1  [8])&InterpreterThunkEmitter::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x554;
  pHVar7 = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
  pIVar8 = (InterpreterThunkEmitter *)new<Memory::HeapAllocator>(0x290,pHVar7,0x2f6726);
  InterpreterThunkEmitter::InterpreterThunkEmitter
            (pIVar8,this,&this->sourceCodeAllocator,&this->threadContext->thunkPageAllocators,true);
  this->asmJsInterpreterThunkEmitter = pIVar8;
  pSVar1 = this->profiler;
  if (pSVar1 != (ScriptContextProfiler *)0x0) {
    Memory::Recycler::SetProfiler
              (this->threadContext->recycler,pSVar1->profiler,pSVar1->backgroundRecyclerProfiler);
  }
  JavascriptLibrary::DumpLibraryByteCode((this->super_ScriptContextBase).javascriptLibrary);
  this->isInitialized = true;
  return;
}

Assistant:

void ScriptContext::InitializePostGlobal()
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        this->GetDebugContext()->Initialize();

        this->GetDebugContext()->GetProbeContainer()->Initialize(this);

        isDebugContextInitialized = true;
#endif

#if defined(_M_ARM32_OR_ARM64)
        // We need to ensure that the above write to the isDebugContextInitialized is visible to the debugger thread.
        MemoryBarrier();
#endif

        AssertMsg(this->CurrentThunk == DefaultEntryThunk, "Creating non default thunk while initializing");
        AssertMsg(this->DeferredParsingThunk == DefaultDeferredParsingThunk, "Creating non default thunk while initializing");
        AssertMsg(this->DeferredDeserializationThunk == DefaultDeferredDeserializeThunk, "Creating non default thunk while initializing");

#ifdef FIELD_ACCESS_STATS
        this->fieldAccessStatsByFunctionNumber = RecyclerNew(this->recycler, FieldAccessStatsByFunctionNumberMap, recycler);
        BindReference(this->fieldAccessStatsByFunctionNumber);
#endif

        if (!sourceList)
        {
            AutoCriticalSection critSec(threadContext->GetFunctionBodyLock());
            sourceList.Root(RecyclerNew(this->GetRecycler(), SourceList, this->GetRecycler()), this->GetRecycler());
        }

#if DYNAMIC_INTERPRETER_THUNK
        interpreterThunkEmitter = HeapNew(InterpreterThunkEmitter, this, SourceCodeAllocator(), this->GetThreadContext()->GetThunkPageAllocators());
#endif

#ifdef ASMJS_PLAT
        asmJsInterpreterThunkEmitter = HeapNew(InterpreterThunkEmitter, this, SourceCodeAllocator(), this->GetThreadContext()->GetThunkPageAllocators(),
            true);
#endif

        JS_ETW(EtwTrace::LogScriptContextLoadEvent(this));
        JS_ETW_INTERNAL(EventWriteJSCRIPT_HOST_SCRIPT_CONTEXT_START(this));

#ifdef PROFILE_EXEC
        if (profiler != nullptr)
        {
            this->threadContext->GetRecycler()->SetProfiler(profiler->GetProfiler(), profiler->GetBackgroundRecyclerProfiler());
        }
#endif

#if DBG
        this->javascriptLibrary->DumpLibraryByteCode();

        isInitialized = TRUE;
#endif
    }